

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverBestLiteralCover(Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  int *piVar1;
  int _i_;
  uint uVar2;
  int iVar3;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  
  pCover_00 = Mvc_CoverClone(pCover);
  pMVar4 = Mvc_CubeAlloc(pCover_00);
  uVar2 = *(uint *)&pMVar4->field_0x8 & 0xffffff;
  if (uVar2 == 0) {
    pMVar4->pData[0] = 0;
  }
  else if (uVar2 == 1) {
    *(undefined8 *)pMVar4->pData = 0;
  }
  else {
    for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
      pMVar4->pData[uVar2] = 0;
    }
  }
  iVar3 = Mvc_CoverReadCubeNum(pSimple);
  if (iVar3 != 1) {
    __assert_fail("Mvc_CoverReadCubeNum(pSimple) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/mvc/mvcLits.c"
                  ,0xee,"Mvc_Cover_t *Mvc_CoverBestLiteralCover(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pMVar5 = Mvc_CoverReadCubeHead(pSimple);
  iVar3 = Mvc_CoverBestLiteral(pCover,pMVar5);
  pMVar4->pData[iVar3 >> 5] = pMVar4->pData[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
  if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar5 = (Mvc_Cube_t *)&pCover_00->lCubes;
  }
  else {
    pMVar5 = (pCover_00->lCubes).pTail;
  }
  pMVar5->pNext = pMVar4;
  (pCover_00->lCubes).pTail = pMVar4;
  pMVar4->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover_00->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverBestLiteralCover( Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Mvc_Cover_t * pCoverNew;
    Mvc_Cube_t * pCubeNew;
    Mvc_Cube_t * pCubeS;
    int iLitBest;

    // create the new cover
    pCoverNew = Mvc_CoverClone( pCover );
    // get the new cube
    pCubeNew = Mvc_CubeAlloc( pCoverNew );
    // clean the cube
    Mvc_CubeBitClean( pCubeNew );

    // get the first cube of pSimple
    assert( Mvc_CoverReadCubeNum(pSimple) == 1 );
    pCubeS = Mvc_CoverReadCubeHead( pSimple );
    // find the best literal among those of pCubeS
    iLitBest = Mvc_CoverBestLiteral( pCover, pCubeS );

    // insert this literal into the cube
    Mvc_CubeBitInsert( pCubeNew, iLitBest );
    // add the cube to the cover
    Mvc_CoverAddCubeTail( pCoverNew, pCubeNew );
    return pCoverNew;
}